

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O0

exr_result_t save_attr_64(exr_context_t ctxt,void *ptr,int n)

{
  exr_result_t eVar1;
  int in_EDX;
  void *in_RSI;
  long in_RDI;
  
  priv_from_native64(in_RSI,in_EDX);
  eVar1 = (**(code **)(in_RDI + 0x30))(in_RDI,in_RSI,(long)in_EDX << 3,in_RDI + 0xb0);
  return eVar1;
}

Assistant:

static exr_result_t
save_attr_64 (exr_context_t ctxt, void* ptr, int n)
{
    priv_from_native64 (ptr, n);

    return ctxt->do_write (
        ctxt,
        ptr,
        sizeof (int64_t) * (uint64_t) (n),
        &(ctxt->output_file_offset));
}